

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

bool __thiscall
ON_Font::SetFromFontDescription(ON_Font *this,wchar_t *font_description,wchar_t *postscript_name)

{
  ON_wString *this_00;
  Weight font_weight;
  ON_Font *pOVar1;
  bool bVar2;
  int iVar3;
  int i;
  wchar_t wVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  wchar_t *pwVar8;
  wchar_t *pwVar9;
  wchar_t *pwVar10;
  ulong uVar11;
  Weight WVar12;
  size_t string_length;
  undefined8 in_R8;
  Stretch font_stretch;
  double in_XMM1_Qa;
  Style local_7d;
  ON_wString local_face_name;
  wchar_t *s1;
  ON_wString local_postscript_name;
  ON_wString local_font_description;
  undefined8 local_58;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined8 local_44;
  undefined4 local_3c;
  ON_Font *local_38;
  
  ON_wString::ON_wString(&local_font_description,font_description);
  ON_wString::TrimLeftAndRight(&local_font_description,(wchar_t *)0x0);
  pwVar8 = ON_wString::operator_cast_to_wchar_t_(&local_font_description);
  ON_wString::ON_wString(&local_postscript_name,postscript_name);
  ON_wString::TrimLeftAndRight(&local_postscript_name,(wchar_t *)0x0);
  ON_wString::operator_cast_to_wchar_t_(&local_postscript_name);
  if ((pwVar8 == (wchar_t *)0x0) || (*pwVar8 < L'!')) {
    pwVar8 = ON_wString::operator_cast_to_wchar_t_(&local_postscript_name);
    ON_wString::operator=(&local_font_description,&local_postscript_name);
    if ((pwVar8 == (wchar_t *)0x0) || (*pwVar8 < L'!')) {
      bVar2 = false;
      goto LAB_00486d2a;
    }
  }
  ON_wString::ON_wString(&local_face_name,pwVar8);
  iVar3 = ON_wString::Length(&local_face_name);
  i = ON_wString::Length(L"Times New Roman");
  if ((iVar3 < i) ||
     ((i < iVar3 && (pwVar9 = ON_wString::operator[](&local_face_name,i), L' ' < *pwVar9)))) {
LAB_004868c6:
    pwVar8 = (wchar_t *)0x0;
  }
  else {
    in_R8 = 1;
    bVar2 = ON_wString::EqualOrdinal(L"Times New Roman",i,pwVar8,i,true);
    if (!bVar2) goto LAB_004868c6;
    pwVar8 = ON_wString::operator_cast_to_wchar_t_(&local_face_name);
    pwVar8 = pwVar8 + i;
  }
  if (pwVar8 == (wchar_t *)0x0) {
    pwVar8 = ON_wString::operator_cast_to_wchar_t_(&local_face_name);
    pwVar8 = pwVar8 + 1;
  }
  wVar4 = *pwVar8;
  local_38 = this;
  font_weight = Default.m_font_weight;
  if (wVar4 != L'\0') {
    pwVar9 = pwVar8;
    do {
      pwVar10 = pwVar9;
      if (0x19 < (uint)((wVar4 & 0xffffffdfU) - 0x41U)) {
switchD_004869e2_caseD_0:
        bVar2 = false;
        goto LAB_00486a3b;
      }
      s1 = pwVar9;
      uVar5 = ParseToken(&s1,4,(wchar_t **)&PTR_anon_var_dwarf_26c1c7_0081e7e0,(uint *)&DAT_006bdf80
                         ,(uint)in_R8);
      if (uVar5 == 0) {
        local_48 = 3;
        local_50 = 4;
      }
      else {
        local_50 = 0;
        if (((s1 != (wchar_t *)0x0) && ((uint)(*s1 + L'\xffffffe0') < 0x40)) &&
           ((0x8000000008007001U >> ((ulong)(uint)(*s1 + L'\xffffffe0') & 0x3f) & 1) != 0)) {
          s1 = s1 + 1;
        }
        local_48 = 0;
      }
      local_58 = (wchar_t *)0x200000001;
      local_44 = 0x600000005;
      local_3c = 6;
      local_4c = local_50;
      uVar6 = ParseToken(&s1,8,(wchar_t **)&PTR_anon_var_dwarf_26c1f7_0081e780,(uint *)&local_58,
                         (uint)in_R8);
      bVar2 = false;
      switch(uVar6) {
      case 0:
        goto switchD_004869e2_caseD_0;
      case 1:
        bVar2 = true;
        font_weight = Thin;
        break;
      case 2:
        WVar12 = Ultralight;
        goto LAB_00486a22;
      case 3:
        bVar2 = true;
        font_weight = Normal;
        break;
      case 4:
        bVar2 = true;
        font_weight = Medium;
        break;
      case 5:
        WVar12 = Ultrabold;
LAB_00486a22:
        bVar2 = uVar5 < 3;
        if (uVar5 < 3) {
          font_weight = WVar12;
        }
        break;
      case 6:
        bVar2 = true;
        font_weight = Heavy;
      }
      if (bVar2) {
        pwVar10 = s1;
      }
LAB_00486a3b:
      if (bVar2) {
        for (; pwVar9 < pwVar10; pwVar9 = pwVar9 + 1) {
          *pwVar9 = L'\x01';
        }
      }
      if (bVar2) break;
      wVar4 = pwVar9[1];
      pwVar9 = pwVar9 + 1;
    } while (wVar4 != L'\0');
  }
  local_7d = Default.m_font_style;
  wVar4 = *pwVar8;
  if (wVar4 != L'\0') {
    pwVar9 = pwVar8;
    do {
      pwVar10 = pwVar9;
      if ((uint)((wVar4 & 0xffffffdfU) - 0x41U) < 0x1a) {
        local_58 = pwVar9;
        uVar5 = ParseToken((wchar_t **)&local_58,4,(wchar_t **)&PTR_anon_var_dwarf_26c257_0081e7c0,
                           (uint *)&DAT_006bdf90,(uint)in_R8);
        bVar2 = false;
        switch(uVar5) {
        case 0:
          goto switchD_00486ad1_caseD_0;
        case 1:
          local_7d = Upright;
          bVar2 = true;
          break;
        case 2:
          bVar2 = true;
          local_7d = Italic;
          break;
        case 3:
          bVar2 = true;
          local_7d = Oblique;
        }
        if (bVar2) {
          pwVar10 = local_58;
        }
      }
      else {
        bVar2 = false;
      }
switchD_00486ad1_caseD_0:
      if (bVar2) {
        for (; pwVar9 < pwVar10; pwVar9 = pwVar9 + 1) {
          *pwVar9 = L'\x01';
        }
      }
      if (bVar2) break;
      wVar4 = pwVar9[1];
      pwVar9 = pwVar9 + 1;
    } while (wVar4 != L'\0');
  }
  uVar5 = (uint)Default.m_font_stretch;
  wVar4 = *pwVar8;
  font_stretch = Default.m_font_stretch;
  if (wVar4 != L'\0') {
    do {
      pwVar9 = pwVar8;
      if ((uint)((wVar4 & 0xffffffdfU) - 0x41U) < 0x1a) {
        s1 = pwVar8;
        uVar6 = ParseToken(&s1,4,(wchar_t **)&PTR_anon_var_dwarf_26c1c7_0081e7e0,
                           (uint *)&DAT_006bdf90,(uint)in_R8);
        bVar2 = uVar6 == 0;
        if (bVar2) {
          local_50 = 2;
        }
        else {
          local_50 = 0;
          if (((s1 != (wchar_t *)0x0) && ((uint)(*s1 + L'\xffffffe0') < 0x40)) &&
             ((0x8000000008007001U >> ((ulong)(uint)(*s1 + L'\xffffffe0') & 0x3f) & 1) != 0)) {
            s1 = s1 + 1;
            local_50 = 0;
          }
        }
        local_58 = (wchar_t *)CONCAT44(local_50,1);
        local_4c = 3;
        uVar7 = ParseToken(&s1,4,(wchar_t **)&PTR_anon_var_dwarf_26c287_0081e800,(uint *)&local_58,
                           (uint)in_R8);
        switch(uVar7) {
        case 0:
          bVar2 = false;
          goto LAB_00486c5b;
        case 1:
          if (3 < uVar6) goto switchD_00486c02_default;
          uVar5 = 0x1020403;
LAB_00486c40:
          uVar5 = uVar5 >> ((byte)(uVar6 << 3) & 0x1f);
          bVar2 = true;
          break;
        case 2:
          uVar5 = uVar5 & 0xff;
          if (uVar6 == 0) {
            uVar5 = 5;
          }
          break;
        case 3:
          if (uVar6 < 4) {
            uVar5 = 0x9080607;
            goto LAB_00486c40;
          }
        default:
switchD_00486c02_default:
          bVar2 = false;
        }
        if (bVar2) {
          pwVar9 = s1;
        }
      }
      else {
        bVar2 = false;
      }
LAB_00486c5b:
      font_stretch = (Stretch)uVar5;
      if (bVar2) {
        for (; pwVar8 < pwVar9; pwVar8 = pwVar8 + 1) {
          *pwVar8 = L'\x01';
        }
      }
      if (bVar2) break;
      wVar4 = pwVar8[1];
      pwVar8 = pwVar8 + 1;
    } while (wVar4 != L'\0');
  }
  pwVar8 = ON_wString::operator_cast_to_wchar_t_(&local_face_name);
  wVar4 = *pwVar8;
  if (wVar4 == L'\0') {
    string_length = 0;
  }
  else {
    uVar11 = 0;
    do {
      if (wVar4 < L' ') break;
      wVar4 = pwVar8[uVar11 + 1];
      uVar11 = uVar11 + 1;
    } while (wVar4 != L'\0');
    string_length = uVar11 & 0xffffffff;
  }
  ON_wString::SetLength(&local_face_name,string_length);
  ON_wString::TrimLeftAndRight(&local_face_name,(wchar_t *)0x0);
  pwVar8 = ON_wString::operator_cast_to_wchar_t_(&local_face_name);
  pOVar1 = local_38;
  bVar2 = SetFontCharacteristics
                    (local_38,0.0,pwVar8,font_weight,local_7d,font_stretch,false,false,in_XMM1_Qa,1)
  ;
  if (bVar2) {
    this_00 = &pOVar1->m_loc_postscript_name;
    ON_wString::operator=(this_00,&local_postscript_name);
    ON_wString::operator=(&pOVar1->m_en_postscript_name,this_00);
  }
  ON_wString::~ON_wString(&local_face_name);
LAB_00486d2a:
  ON_wString::~ON_wString(&local_postscript_name);
  ON_wString::~ON_wString(&local_font_description);
  return bVar2;
}

Assistant:

bool ON_Font::SetFromFontDescription(
  const wchar_t* font_description,
  const wchar_t* postscript_name
  )
{
  ON_wString local_font_description(font_description);
  local_font_description.TrimLeftAndRight();
  font_description = static_cast<const wchar_t*>(local_font_description);

  ON_wString local_postscript_name(postscript_name);
  local_postscript_name.TrimLeftAndRight();
  postscript_name = static_cast<const wchar_t*>(local_postscript_name);

  if (nullptr == font_description || font_description[0] <= ON_wString::Space)
  {
    font_description = local_postscript_name;
    local_font_description = local_postscript_name;
    if (nullptr == font_description || font_description[0] <= ON_wString::Space)
      return false;
  }

  // As names are discovered that do not work in the code below,
  // add a special case here.  These are typically fonts that have
  // words like Upright, Italic, Oblique, Regular, Semi, Demi, Extra, Ultra, Medium
  // Black, Heavy, ... as part of the face name and those words must not
  // be parsed as possible weight, style or stretch characteristics applied
  // to a root face name.
  const wchar_t* special_cases[] = {
    // Apple's "Times New Roman" and "Times New Roman Bold Italic" is an example of why
    // special cases are required.  The face name is "Times New Roman" and "Roman" no
    // longer indicates an upright style.
    // However, Apple's "Avenir Roman" and "Avenir Oblique" fonts provide an example
    // where "Roman" is style and "Avenir" is a face name.  The default parsing
    // handles Avenir and any other font names that are using Roman as a style.
    L"Times New Roman", 

    // Put new special case names above this nullptr which terminates the special_cases[] list.
    nullptr
  };

  // NOTE WELL: 
  //  It is important that local_face_name be created from a pointer
  //  so that it's string buffer is not shared with other ON_wStrings.
  //  wchar_t values in local_face_name are modifed via const_cast<> below.
  ON_wString local_face_name = static_cast<const wchar_t*>(font_description);
  const wchar_t* characteristics = nullptr;
  int face_name_length = local_face_name.Length();
  for (int i = 0; nullptr != special_cases[i]; i++)
  {
    const int special_case_length = ON_wString::Length(special_cases[i]);
    if (special_case_length > face_name_length)
      continue;
    
    if (special_case_length < face_name_length && local_face_name[special_case_length] > ON_wString::Space )
      continue;
    
    if (false == ON_wString::EqualOrdinal(special_cases[i], special_case_length, font_description, special_case_length, true))
      continue;

    characteristics = static_cast<const wchar_t*>(local_face_name) + special_case_length;
    break;
  }

  if (nullptr == characteristics)
    characteristics = static_cast<const wchar_t*>(local_face_name) + 1;

  const wchar_t x = (wchar_t)1;

  ON_Font::Weight font_weight = ON_Font::Default.m_font_weight;
  for (wchar_t* s0 = const_cast<wchar_t*>(characteristics); 0 != *s0; s0++)
  {
    const wchar_t* s1 = s0;
    if (ParseWeight(s1, font_weight))
    {
      while ( s0 < s1 )
        *s0++ = x; // NOTE - modifies local_face_name content
      break;
    }
  }

  ON_Font::Style font_style = ON_Font::Default.m_font_style;
  for (wchar_t* s0 = const_cast<wchar_t*>(characteristics); 0 != *s0; s0++)
  {
    const wchar_t* s1 = s0;
    if (ParseStyle(s1, font_style))
    {
      while ( s0 < s1 )
        *s0++ = x; // NOTE - modifies local_face_name content
      break;
    }
  }

  ON_Font::Stretch font_stretch = ON_Font::Default.m_font_stretch;
  for (wchar_t* s0 = const_cast<wchar_t*>(characteristics); 0 != *s0; s0++)
  {
    const wchar_t* s1 = s0;
    if (ParseStretch(s1, font_stretch))
    {
      while ( s0 < s1 )
        *s0++ = x; // NOTE - modifies local_face_name content
      break;
    }
  }

  face_name_length = 0;
  for (const wchar_t* s = static_cast<const wchar_t*>(local_face_name); 0 != *s; s++)
  {
    if (*s >= ON_wString::Space)
      face_name_length++;
    else
    {
      while (*s > 0 && *s <= ON_wString::Space)
        s++;
      break;
    }
  }
  local_face_name.SetLength(face_name_length);
  local_face_name.TrimLeftAndRight();
  const wchar_t* face_name = static_cast<const wchar_t*>(local_face_name);

  bool rc = SetFontCharacteristics(
    face_name,
    font_weight,
    font_style,
    font_stretch,
    false,
    false,
    ON_FontMetrics::DefaultLineFeedRatio,
    ON_Font::WindowsConstants::logfont_default_charset
    );

  if (rc)
  {
    m_loc_postscript_name = local_postscript_name;
    m_en_postscript_name = m_loc_postscript_name;
  }  

  return rc;
}